

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> * __thiscall
kainjow::mustache::basic_mustache<std::__cxx11::string>::render<std::ostream>
          (basic_mustache<std::__cxx11::string> *this,
          basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,basic_ostream<char,_std::char_traits<char>_> *stream)

{
  undefined8 uVar1;
  anon_class_8_1_6bf940be local_b8;
  render_handler local_b0;
  undefined1 local_90 [8];
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  context;
  basic_ostream<char,_std::char_traits<char>_> *stream_local;
  basic_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  context.line_buffer._32_8_ = stream;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::context_internal((context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_90,ctx);
  local_b8.stream = (basic_ostream<char,_std::char_traits<char>_> *)context.line_buffer._32_8_;
  std::function<void(std::__cxx11::string_const&)>::
  function<kainjow::mustache::basic_mustache<std::__cxx11::string>::render<std::ostream>(kainjow::mustache::basic_context<std::__cxx11::string>&,std::ostream&)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_b0,&local_b8);
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  render((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this,&local_b0,
         (context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_90,true);
  Catch::clara::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b0);
  uVar1 = context.line_buffer._32_8_;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~context_internal((context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_90);
  return (basic_ostream<char,_std::char_traits<char>_> *)uVar1;
}

Assistant:

stream_type& render(basic_context<string_type>& ctx, stream_type& stream) {
        context_internal<string_type> context{ctx};
        render([&stream](const string_type& str) {
            stream << str;
        }, context);
        return stream;
    }